

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtAig.c
# Opt level: O2

void Cgt_ManCollectVisited_rec(Aig_Man_t *pAig,Aig_Obj_t *pObj,Vec_Ptr_t *vVisited)

{
  uint uVar1;
  
  uVar1 = (uint)*(undefined8 *)&pObj->field_0x18;
  if (((uVar1 & 7) != 2) && (pObj->TravId != pAig->nTravIds)) {
    pObj->TravId = pAig->nTravIds;
    if (0xfffffffd < (uVar1 & 7) - 7) {
      Cgt_ManCollectVisited_rec
                (pAig,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vVisited);
      Cgt_ManCollectVisited_rec
                (pAig,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),vVisited);
      Vec_PtrPush(vVisited,pObj);
      return;
    }
    __assert_fail("Aig_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/cgt/cgtAig.c"
                  ,0x9e,"void Cgt_ManCollectVisited_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  return;
}

Assistant:

void Cgt_ManCollectVisited_rec( Aig_Man_t * pAig, Aig_Obj_t * pObj, Vec_Ptr_t * vVisited )
{
    if ( Aig_ObjIsCi(pObj) )
        return;
    if ( Aig_ObjIsTravIdCurrent(pAig, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(pAig, pObj);
    assert( Aig_ObjIsNode(pObj) );
    Cgt_ManCollectVisited_rec( pAig, Aig_ObjFanin0(pObj), vVisited );
    Cgt_ManCollectVisited_rec( pAig, Aig_ObjFanin1(pObj), vVisited );
    Vec_PtrPush( vVisited, pObj );
}